

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUICheckBox.cpp
# Opt level: O0

void __thiscall irr::gui::CGUICheckBox::draw(CGUICheckBox *this)

{
  byte bVar1;
  int iVar2;
  u32 uVar3;
  undefined4 uVar4;
  ulong uVar5;
  undefined8 *puVar6;
  undefined8 uVar7;
  long *in_RDI;
  IGUIFont *font;
  EGUI_DEFAULT_COLOR col;
  rect<int> checkRect;
  s32 height;
  SColor bgColor;
  rect<int> frameRect;
  IVideoDriver *driver;
  IGUISkin *skin;
  rect<int> *this_00;
  string<wchar_t> *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  long *plVar8;
  rect<int> *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined1 local_80 [32];
  undefined8 *local_60;
  vector2d<int> local_58;
  undefined4 local_50;
  undefined4 local_4c;
  int local_48;
  int iStack_44;
  vector2d<int> local_40;
  int local_38;
  SColor local_34;
  undefined4 local_30;
  undefined4 local_2c;
  rect<int> local_28;
  long *local_18;
  long *local_10;
  
  if ((*(byte *)(in_RDI + 0x14) & 1) != 0) {
    local_10 = (long *)(**(code **)(*(long *)in_RDI[0x25] + 0x60))();
    if (local_10 != (long *)0x0) {
      local_18 = (long *)(**(code **)(*(long *)in_RDI[0x25] + 0x30))();
      local_28.UpperLeftCorner = *(vector2d<int> *)(in_RDI + 8);
      local_28.LowerRightCorner = *(vector2d<int> *)(in_RDI + 9);
      if ((*(byte *)((long)in_RDI + 0x13b) & 1) != 0) {
        local_30 = (**(code **)*local_10)(local_10,2);
        local_2c = local_30;
        (**(code **)(*local_18 + 0x198))(local_18,local_30,&local_28,in_RDI + 10);
      }
      plVar8 = local_10;
      if ((*(byte *)((long)in_RDI + 0x13a) & 1) != 0) {
        video::SColor::SColor(&local_34,0);
        (**(code **)(*plVar8 + 0x70))(plVar8,in_RDI,local_34.color,1,0,&local_28,in_RDI + 10);
        iVar2 = (**(code **)(*local_10 + 0x10))(local_10,8);
        local_28.UpperLeftCorner.X = iVar2 + local_28.UpperLeftCorner.X;
        iVar2 = (**(code **)(*local_10 + 0x10))(local_10,8);
        local_28.LowerRightCorner.X = local_28.LowerRightCorner.X - iVar2;
      }
      local_38 = (**(code **)(*local_10 + 0x10))(local_10,3);
      core::rect<int>::getHeight(&local_28);
      core::rect<int>::rect
                (in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                 (int)in_stack_ffffffffffffff38,(int)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                 (int)in_stack_ffffffffffffff30);
      local_40.Y = iStack_44 + local_38;
      local_40.X = local_48 + local_38;
      local_4c = 0x17;
      uVar5 = (**(code **)(*in_RDI + 0x90))();
      plVar8 = local_10;
      if (((uVar5 & 1) != 0) && (local_4c = 0x16, (*(byte *)(in_RDI + 0x27) & 1) != 0)) {
        local_4c = 0x18;
      }
      local_50 = (**(code **)*local_10)(local_10,local_4c);
      this_00 = (rect<int> *)(in_RDI + 10);
      (**(code **)(*plVar8 + 0x70))(plVar8,in_RDI,local_50,0,1,&local_48);
      plVar8 = local_10;
      if ((*(byte *)((long)in_RDI + 0x139) & 1) != 0) {
        local_58 = core::rect<int>::getCenter(this_00);
        in_stack_ffffffffffffff54 = *(undefined4 *)((long)in_RDI + 0x134);
        uVar3 = os::Timer::getTime();
        in_stack_ffffffffffffff30 = (string<wchar_t> *)(in_RDI + 10);
        this_00 = (rect<int> *)((ulong)this_00 & 0xffffffff00000000);
        (**(code **)(*plVar8 + 0xa0))(plVar8,in_RDI,10,local_58,in_stack_ffffffffffffff54,uVar3);
      }
      uVar3 = core::string<wchar_t>::size((string<wchar_t> *)0x3a0b88);
      if (uVar3 != 0) {
        local_40 = local_28.LowerRightCorner;
        local_48 = local_28.UpperLeftCorner.X;
        iStack_44 = local_28.UpperLeftCorner.Y;
        _local_48 = CONCAT44(iStack_44,local_38 + 5 + local_48);
        puVar6 = (undefined8 *)(**(code **)(*local_10 + 0x30))(local_10,0);
        local_60 = puVar6;
        if (puVar6 != (undefined8 *)0x0) {
          core::string<wchar_t>::c_str((string<wchar_t> *)0x3a0c05);
          core::string<wchar_t>::string<wchar_t>(in_stack_ffffffffffffff30,(wchar_t *)this_00);
          plVar8 = local_10;
          bVar1 = (**(code **)(*in_RDI + 0x90))();
          uVar7 = 9;
          if ((bVar1 & 1) != 0) {
            uVar7 = 8;
          }
          uVar4 = (**(code **)*plVar8)(plVar8,uVar7);
          (**(code **)*puVar6)(puVar6,local_80,&local_48,uVar4,0,1,in_RDI + 10);
          core::string<wchar_t>::~string((string<wchar_t> *)0x3a0c88);
        }
      }
    }
    IGUIElement::draw((IGUIElement *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  }
  return;
}

Assistant:

void CGUICheckBox::draw()
{
	if (!IsVisible)
		return;

	IGUISkin *skin = Environment->getSkin();
	if (skin) {
		video::IVideoDriver *driver = Environment->getVideoDriver();
		core::rect<s32> frameRect(AbsoluteRect);

		// draw background
		if (Background) {
			video::SColor bgColor = skin->getColor(gui::EGDC_3D_FACE);
			driver->draw2DRectangle(bgColor, frameRect, &AbsoluteClippingRect);
		}

		// draw the border
		if (Border) {
			skin->draw3DSunkenPane(this, 0, true, false, frameRect, &AbsoluteClippingRect);
			frameRect.UpperLeftCorner.X += skin->getSize(EGDS_TEXT_DISTANCE_X);
			frameRect.LowerRightCorner.X -= skin->getSize(EGDS_TEXT_DISTANCE_X);
		}

		const s32 height = skin->getSize(EGDS_CHECK_BOX_WIDTH);

		// the rectangle around the "checked" area.
		core::rect<s32> checkRect(frameRect.UpperLeftCorner.X,
				((frameRect.getHeight() - height) / 2) + frameRect.UpperLeftCorner.Y,
				0, 0);

		checkRect.LowerRightCorner.X = checkRect.UpperLeftCorner.X + height;
		checkRect.LowerRightCorner.Y = checkRect.UpperLeftCorner.Y + height;

		EGUI_DEFAULT_COLOR col = EGDC_GRAY_EDITABLE;
		if (isEnabled())
			col = Pressed ? EGDC_FOCUSED_EDITABLE : EGDC_EDITABLE;
		skin->draw3DSunkenPane(this, skin->getColor(col),
				false, true, checkRect, &AbsoluteClippingRect);

		// the checked icon
		if (Checked) {
			skin->drawIcon(this, EGDI_CHECK_BOX_CHECKED, checkRect.getCenter(),
					CheckTime, os::Timer::getTime(), false, &AbsoluteClippingRect);
		}

		// associated text
		if (Text.size()) {
			checkRect = frameRect;
			checkRect.UpperLeftCorner.X += height + 5;

			IGUIFont *font = skin->getFont();
			if (font) {
				font->draw(Text.c_str(), checkRect,
						skin->getColor(isEnabled() ? EGDC_BUTTON_TEXT : EGDC_GRAY_TEXT), false, true, &AbsoluteClippingRect);
			}
		}
	}
	IGUIElement::draw();
}